

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_block_sizes.cpp
# Opt level: O0

bool decode_block_mode_3d
               (uint block_mode,uint *x_weights,uint *y_weights,uint *z_weights,bool *is_dual_plane,
               uint *quant_mode,uint *weight_bits)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  uint in_EDI;
  undefined8 in_R8;
  int *in_R9;
  uint *in_stack_00000008;
  uint weight_count;
  int B_1;
  uint C;
  uint B;
  uint A;
  uint D;
  uint H;
  uint base_quant_mode;
  bool local_61;
  ulong in_stack_ffffffffffffffa8;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_38 = in_EDI >> 9 & 1;
  local_3c = in_EDI >> 10 & 1;
  uVar1 = in_EDI >> 5 & 3;
  *in_RSI = 0;
  *in_RDX = 0;
  *in_RCX = 0;
  if ((in_EDI & 3) == 0) {
    uVar2 = in_EDI >> 2 & 3;
    if ((in_EDI >> 2 & 3) == 0) {
      return false;
    }
    uVar3 = in_EDI >> 9 & 3;
    if ((in_EDI >> 7 & 3) != 3) {
      local_3c = 0;
      local_38 = 0;
    }
    in_stack_ffffffffffffffa8 = (ulong)(in_EDI >> 7 & 3);
    switch(in_stack_ffffffffffffffa8) {
    case 0:
      *in_RSI = 6;
      *in_RDX = uVar3 + 2;
      *in_RCX = uVar1 + 2;
      break;
    case 1:
      *in_RSI = uVar1 + 2;
      *in_RDX = 6;
      *in_RCX = uVar3 + 2;
      break;
    case 2:
      *in_RSI = uVar1 + 2;
      *in_RDX = uVar3 + 2;
      *in_RCX = 6;
      break;
    case 3:
      *in_RSI = 2;
      *in_RDX = 2;
      *in_RCX = 2;
      switch(in_EDI >> 5 & 3) {
      case 0:
        *in_RSI = 6;
        break;
      case 1:
        *in_RDX = 6;
        break;
      case 2:
        *in_RCX = 6;
        break;
      case 3:
        return false;
      }
    }
  }
  else {
    uVar2 = in_EDI & 3;
    *in_RSI = uVar1 + 2;
    *in_RDX = (in_EDI >> 7 & 3) + 2;
    *in_RCX = (in_EDI >> 2 & 3) + 2;
  }
  local_34 = uVar2 << 1 | in_EDI >> 4 & 1;
  uVar1 = *in_RSI * *in_RDX * *in_RCX * (local_3c + 1);
  *in_R9 = (local_34 - 2) + local_38 * 6;
  *(bool *)in_R8 = local_3c != 0;
  uVar2 = get_ise_sequence_bitcount(uVar1,(quant_method)(in_stack_ffffffffffffffa8 >> 0x20));
  *in_stack_00000008 = uVar2;
  local_61 = false;
  if ((uVar1 < 0x41) && (local_61 = false, 0x17 < *in_stack_00000008)) {
    local_61 = *in_stack_00000008 < 0x61;
  }
  return local_61;
}

Assistant:

static bool decode_block_mode_3d(
	unsigned int block_mode,
	unsigned int& x_weights,
	unsigned int& y_weights,
	unsigned int& z_weights,
	bool& is_dual_plane,
	unsigned int& quant_mode,
	unsigned int& weight_bits
) {
	unsigned int base_quant_mode = (block_mode >> 4) & 1;
	unsigned int H = (block_mode >> 9) & 1;
	unsigned int D = (block_mode >> 10) & 1;
	unsigned int A = (block_mode >> 5) & 0x3;

	x_weights = 0;
	y_weights = 0;
	z_weights = 0;

	if ((block_mode & 3) != 0)
	{
		base_quant_mode |= (block_mode & 3) << 1;
		unsigned int B = (block_mode >> 7) & 3;
		unsigned int C = (block_mode >> 2) & 0x3;
		x_weights = A + 2;
		y_weights = B + 2;
		z_weights = C + 2;
	}
	else
	{
		base_quant_mode |= ((block_mode >> 2) & 3) << 1;
		if (((block_mode >> 2) & 3) == 0)
		{
			return false;
		}

		int B = (block_mode >> 9) & 3;
		if (((block_mode >> 7) & 3) != 3)
		{
			D = 0;
			H = 0;
		}
		switch ((block_mode >> 7) & 3)
		{
		case 0:
			x_weights = 6;
			y_weights = B + 2;
			z_weights = A + 2;
			break;
		case 1:
			x_weights = A + 2;
			y_weights = 6;
			z_weights = B + 2;
			break;
		case 2:
			x_weights = A + 2;
			y_weights = B + 2;
			z_weights = 6;
			break;
		case 3:
			x_weights = 2;
			y_weights = 2;
			z_weights = 2;
			switch ((block_mode >> 5) & 3)
			{
			case 0:
				x_weights = 6;
				break;
			case 1:
				y_weights = 6;
				break;
			case 2:
				z_weights = 6;
				break;
			case 3:
				return false;
			}
			break;
		}
	}

	unsigned int weight_count = x_weights * y_weights * z_weights * (D + 1);
	quant_mode = (base_quant_mode - 2) + 6 * H;
	is_dual_plane = D != 0;

	weight_bits = get_ise_sequence_bitcount(weight_count, static_cast<quant_method>(quant_mode));
	return (weight_count <= BLOCK_MAX_WEIGHTS &&
	        weight_bits >= BLOCK_MIN_WEIGHT_BITS &&
	        weight_bits <= BLOCK_MAX_WEIGHT_BITS);
}